

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm.cpp
# Opt level: O1

void EBPLM::PredictVelOnXFace
               (Box *xebox,Array4<double> *Imx,Array4<double> *Ipx,Array4<const_double> *q,
               Array4<const_double> *ccvel,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  BCRec *bcrec;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  double *pdVar37;
  long lVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  double *pdVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  double *pdVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  EBCellFlag *pEVar50;
  long lVar51;
  long lVar52;
  double *pdVar53;
  double *pdVar54;
  long lVar55;
  long lVar56;
  double *pdVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  double *pdVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  double *pdVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  undefined8 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  int iVar82;
  int iVar83;
  undefined1 auVar84 [16];
  pair<bool,_bool> pVar85;
  pair<bool,_bool> pVar86;
  pair<bool,_bool> pVar87;
  int jj;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  double **ppdVar117;
  double *pdVar118;
  Long *pLVar119;
  uint uVar120;
  int iVar121;
  long lVar122;
  long lVar123;
  long lVar124;
  long lVar125;
  long lVar126;
  long lVar127;
  long lVar128;
  long lVar129;
  long lVar130;
  long lVar131;
  long lVar132;
  long lVar133;
  int dir;
  int dir_00;
  int iVar134;
  long lVar135;
  long lVar136;
  int iVar137;
  long lVar138;
  int iVar139;
  long lVar140;
  double *pdVar141;
  int iVar142;
  double *pdVar143;
  char cVar144;
  long lVar145;
  long lVar146;
  long lVar147;
  uint uVar148;
  long lVar149;
  double *pdVar150;
  double *pdVar151;
  char cVar152;
  long lVar153;
  long lVar154;
  long lVar155;
  long lVar156;
  int kk_1;
  int iVar157;
  uint uVar158;
  long lVar159;
  int iVar160;
  int iVar161;
  long lVar162;
  long lVar163;
  long lVar164;
  int iVar165;
  long lVar166;
  long lVar167;
  long lVar168;
  int iVar169;
  long lVar170;
  long lVar171;
  double *pdVar172;
  double *pdVar173;
  bool bVar174;
  ulong uVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  ulong uVar180;
  undefined1 auVar181 [16];
  double dVar182;
  double dVar183;
  undefined1 auVar184 [16];
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  Real du [27];
  Real A [27] [3];
  double local_a28;
  double local_9f8;
  long local_9b8;
  double local_968;
  long local_858;
  long local_850;
  double *local_848;
  long local_840;
  double *local_838;
  double *local_7e0;
  double *local_7c8;
  double *local_7c0;
  double *local_7b8;
  double *local_798;
  double *local_790;
  double *local_788;
  double *local_6d8;
  double *local_6d0;
  double *local_6c8;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3e8;
  double dStack_3e0;
  double local_3c8;
  double adStack_3b8 [28];
  anon_class_680_18_15492e0f local_2d8;
  
  dVar176 = dt / (geom->super_CoordSys).dx[0];
  iVar165 = (geom->domain).smallend.vect[0];
  iVar169 = (geom->domain).smallend.vect[1];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar160 = (geom->domain).bigend.vect[0];
  iVar3 = (geom->domain).bigend.vect[1];
  pVar85 = anon_unknown.dwarf_65c5ee::has_extdir_or_ho(bcrec,0,(int)Ipx);
  pVar86 = anon_unknown.dwarf_65c5ee::has_extdir_or_ho(bcrec,1,dir);
  iVar4 = (geom->domain).smallend.vect[2];
  iVar5 = (geom->domain).bigend.vect[2];
  pVar87 = anon_unknown.dwarf_65c5ee::has_extdir_or_ho(bcrec,2,dir_00);
  auVar84 = _DAT_0077bb40;
  if ((((((((ushort)pVar85 & 1) == 0) || (iVar165 < (xebox->smallend).vect[0] + -1)) &&
        ((((ushort)pVar85 >> 8 & 1) == 0 || ((xebox->bigend).vect[0] < iVar160)))) &&
       ((((ushort)pVar87 & 1) == 0 || (iVar4 < (xebox->smallend).vect[2] + -1)))) &&
      ((((ushort)pVar87 >> 8 & 1) == 0 || ((xebox->bigend).vect[2] < iVar5)))) &&
     (((((ushort)pVar86 & 1) == 0 || (iVar169 < (xebox->smallend).vect[1] + -1)) &&
      ((((ushort)pVar86 >> 8 & 1) == 0 || ((xebox->bigend).vect[1] < iVar3)))))) {
    iVar165 = (ccc->begin).y;
    iVar169 = (xebox->smallend).vect[1];
    lVar124 = (long)iVar169 + -1;
    lVar32 = ccc->jstride;
    lVar93 = (lVar124 - iVar165) * lVar32;
    iVar160 = (ccc->begin).z;
    iVar3 = (xebox->smallend).vect[2];
    lVar145 = (long)iVar3 + -1;
    lVar33 = ccc->kstride;
    lVar122 = (lVar145 - iVar160) * lVar33;
    lVar34 = ccc->nstride;
    iVar4 = (xebox->smallend).vect[0];
    lVar138 = (long)iVar4;
    iVar5 = (ccc->begin).x;
    lVar94 = (long)iVar5;
    uVar12 = (q->begin).x;
    lVar162 = (long)(int)uVar12;
    iVar6 = (q->begin).y;
    lVar147 = (long)iVar6;
    lVar35 = q->jstride;
    iVar7 = (q->begin).z;
    lVar170 = (long)iVar7;
    lVar36 = q->kstride;
    pdVar37 = q->p;
    lVar38 = q->nstride;
    pdVar39 = ccvel->p;
    lVar40 = ccvel->jstride;
    lVar41 = ccvel->kstride;
    lVar140 = (long)(ccvel->begin).x;
    iVar8 = (ccvel->begin).y;
    iVar9 = (ccvel->begin).z;
    pdVar42 = Imx->p;
    lVar43 = Imx->jstride;
    lVar44 = Imx->kstride;
    lVar45 = Imx->nstride;
    iVar10 = (Imx->begin).x;
    iVar11 = (Imx->begin).y;
    iVar137 = (Imx->begin).z;
    pdVar46 = Ipx->p;
    lVar47 = Ipx->jstride;
    lVar48 = Ipx->kstride;
    lVar49 = Ipx->nstride;
    uVar13 = (Ipx->begin).x;
    iVar14 = (Ipx->begin).y;
    iVar15 = (Ipx->begin).z;
    pEVar50 = flag->p;
    lVar51 = flag->jstride;
    lVar52 = flag->kstride;
    lVar149 = (long)(flag->begin).x;
    iVar16 = (flag->begin).y;
    iVar17 = (flag->begin).z;
    pdVar53 = ccc->p;
    pdVar54 = vfrac->p;
    lVar55 = vfrac->jstride;
    lVar56 = vfrac->kstride;
    iVar18 = (vfrac->begin).x;
    lVar95 = (long)iVar18;
    uVar19 = (vfrac->begin).y;
    lVar96 = (long)(int)uVar19;
    uVar20 = (vfrac->begin).z;
    lVar123 = (long)(int)uVar20;
    pdVar57 = fcx->p;
    lVar58 = fcx->jstride;
    lVar59 = fcx->kstride;
    lVar60 = fcx->nstride;
    iVar21 = (fcx->begin).x;
    lVar153 = (long)iVar21;
    iVar22 = (fcx->begin).y;
    iVar23 = (fcx->begin).z;
    pdVar61 = fcy->p;
    lVar62 = fcy->jstride;
    lVar63 = fcy->kstride;
    lVar64 = fcy->nstride;
    lVar154 = (long)(fcy->begin).x;
    iVar24 = (fcy->begin).y;
    iVar25 = (fcy->begin).z;
    pdVar65 = fcz->p;
    lVar66 = fcz->jstride;
    lVar67 = fcz->kstride;
    lVar68 = fcz->nstride;
    lVar155 = (long)(fcz->begin).x;
    iVar26 = (fcz->begin).y;
    iVar27 = (fcz->begin).z;
    iVar28 = (xebox->bigend).vect[0];
    iVar29 = (xebox->bigend).vect[1];
    iVar30 = (xebox->bigend).vect[2];
    local_7e0 = pdVar37 + ((lVar138 +
                           (lVar124 - lVar147) * lVar35 + (lVar145 - lVar170) * lVar36 + -2) -
                          lVar162);
    local_858 = 0;
    do {
      if (iVar3 <= iVar30) {
        lVar124 = local_858 * lVar38;
        local_848 = local_7e0;
        local_850 = (long)iVar3;
        local_7c8 = pdVar53 + ((lVar34 * 2 + lVar138 + lVar93 + lVar122 + -1) - lVar94);
        local_7c0 = pdVar53 + ((lVar34 + lVar138 + lVar93 + lVar122 + -1) - lVar94);
        local_7b8 = pdVar53 + ((lVar138 + lVar93 + lVar122 + -1) - lVar94);
        do {
          if (iVar169 <= iVar29) {
            lVar145 = (local_850 - iVar17) * lVar52;
            lVar163 = (local_850 - lVar123) * lVar56;
            lVar97 = (local_850 - lVar170) * lVar36;
            lVar98 = (local_850 - iVar9) * lVar41;
            lVar99 = (local_850 - iVar23) * lVar59;
            lVar100 = (local_850 - iVar160) * lVar33;
            iVar157 = (int)local_850;
            iVar88 = iVar157 - iVar7;
            lVar101 = iVar88 * lVar36;
            lVar102 = ((local_850 + -1) - lVar123) * lVar56;
            lVar103 = ((local_850 + 1) - lVar123) * lVar56;
            lVar166 = ((local_850 + -1) - lVar170) * lVar36;
            lVar171 = ((local_850 + 1) - lVar170) * lVar36;
            lVar104 = (local_850 - iVar25) * lVar63;
            lVar167 = ((iVar157 + 1) - iVar27) * lVar67;
            lVar168 = (local_850 - iVar27) * lVar67;
            lVar125 = (int)(~uVar20 + iVar157) * lVar56;
            lVar105 = (int)((iVar157 + 1) - uVar20) * lVar56;
            local_838 = local_848;
            local_788 = local_7b8;
            local_790 = local_7c0;
            local_798 = local_7c8;
            local_840 = (long)iVar169;
            do {
              if (iVar4 <= iVar28) {
                lVar106 = (local_840 - iVar16) * lVar51;
                lVar107 = (local_840 - lVar96) * lVar55;
                lVar108 = (local_840 - lVar147) * lVar35;
                lVar109 = (local_840 - iVar8) * lVar40;
                lVar110 = (local_840 - iVar22) * lVar58;
                lVar111 = (local_840 - iVar165) * lVar32;
                iVar139 = (int)local_840;
                iVar89 = iVar139 - iVar6;
                lVar112 = iVar89 * lVar35;
                lVar126 = ((local_840 + -1) - lVar96) * lVar55;
                lVar135 = ((local_840 + 1) - lVar96) * lVar55;
                lVar113 = ((local_840 + -1) - lVar147) * lVar35;
                lVar127 = ((local_840 + 1) - lVar147) * lVar35;
                lVar128 = ((iVar139 + 1) - iVar24) * lVar62;
                lVar129 = (local_840 - iVar24) * lVar62;
                lVar130 = (local_840 - iVar26) * lVar66;
                lVar131 = (int)(~uVar19 + iVar139) * lVar55;
                lVar114 = (int)((iVar139 + 1) - uVar19) * lVar55;
                local_6c8 = local_788;
                local_6d0 = local_790;
                local_6d8 = local_798;
                pdVar143 = local_838;
                lVar146 = (lVar138 << 0x20) - (lVar162 << 0x20);
                lVar156 = lVar138;
                local_9b8 = (ulong)(~uVar12 + iVar4) << 0x20;
                uVar2 = ~uVar12 + iVar4;
                iVar82 = (iVar4 + -2) - iVar5;
                iVar83 = (iVar4 + -2) - uVar12;
                do {
                  uVar31 = pEVar50[lVar145 + lVar106 + (lVar156 - lVar149)].flag;
                  dVar178 = 0.0;
                  dVar177 = 0.0;
                  iVar90 = (int)lVar156;
                  if ((uVar31 >> 0x11 & 1) != 0) {
                    lVar132 = lVar156 - lVar95;
                    dVar203 = pdVar54[lVar107 + lVar132 + lVar163];
                    if ((dVar203 != 1.0) || (NAN(dVar203))) {
LAB_0040cb78:
                      dVar177 = pdVar57[lVar110 + lVar99 + (lVar156 - lVar153)];
                      dVar197 = pdVar57[lVar110 + lVar99 + (lVar156 - lVar153) + lVar60];
                      lVar115 = lVar156 - lVar94;
                      dVar186 = pdVar53[lVar100 + lVar111 + lVar115];
                      dVar183 = pdVar53[lVar100 + lVar111 + lVar115 + lVar34];
                      dVar193 = pdVar53[lVar100 + lVar111 + lVar115 + lVar34 * 2];
                      lVar136 = lVar156 - lVar162;
                      lVar159 = lVar156 + -1;
                      dVar190 = pdVar37[lVar112 + lVar101 + lVar124 + (lVar159 - lVar162)];
                      dVar201 = (pdVar37 + lVar112 + lVar101 + lVar124 + (lVar159 - lVar162))[1];
                      lVar133 = -1;
                      cVar144 = '\x05';
                      lVar164 = 0;
                      pdVar118 = local_6c8;
                      pdVar150 = local_6d8;
                      pdVar172 = local_6d0;
                      do {
                        lVar116 = -1;
                        pdVar141 = pdVar118;
                        pdVar151 = pdVar150;
                        pdVar173 = pdVar172;
                        cVar152 = cVar144;
                        do {
                          iVar92 = (int)lVar164;
                          ppdVar117 = &local_2d8.q.p + (long)iVar92 * 3;
                          lVar164 = 0;
                          do {
                            if (((int)lVar164 == 1 && ((int)lVar116 == 0 && (int)lVar133 == 0)) ||
                               ((1 << (cVar152 + (char)lVar164 & 0x1fU) & uVar31) == 0)) {
                              *ppdVar117 = (double *)0x0;
                              ppdVar117[1] = (double *)0x0;
                              ppdVar117[2] = (double *)0x0;
                            }
                            else {
                              dVar178 = pdVar173[lVar164];
                              *ppdVar117 = (double *)
                                           ((pdVar141[lVar164] + (double)((int)lVar164 + -1)) -
                                           dVar186);
                              ppdVar117[1] = (double *)((dVar178 + (double)(int)lVar116) - dVar183);
                              ppdVar117[2] = (double *)
                                             ((pdVar151[lVar164] + (double)(int)lVar133) -
                                             pdVar53[lVar100 + lVar111 + lVar115 + lVar34 * 2]);
                            }
                            lVar164 = lVar164 + 1;
                            ppdVar117 = ppdVar117 + 3;
                          } while (lVar164 != 3);
                          lVar116 = lVar116 + 1;
                          pdVar151 = pdVar151 + lVar32;
                          pdVar173 = pdVar173 + lVar32;
                          pdVar141 = pdVar141 + lVar32;
                          cVar152 = cVar152 + '\x03';
                          lVar164 = (long)iVar92 + 3;
                        } while (lVar116 != 2);
                        lVar133 = lVar133 + 1;
                        pdVar150 = pdVar150 + lVar33;
                        pdVar172 = pdVar172 + lVar33;
                        pdVar118 = pdVar118 + lVar33;
                        cVar144 = cVar144 + '\t';
                        lVar164 = (long)iVar92 + 3;
                      } while (lVar133 != 2);
                      lVar115 = -1;
                      cVar144 = '\x05';
                      lVar133 = 0;
                      do {
                        lVar164 = -1;
                        cVar152 = cVar144;
                        do {
                          iVar92 = (int)lVar133;
                          lVar116 = 0;
                          lVar133 = local_9b8;
                          do {
                            dVar178 = 0.0;
                            if (((int)lVar116 != 1 || ((int)lVar164 != 0 || (int)lVar115 != 0)) &&
                               ((1 << (cVar152 + (char)lVar116 & 0x1fU) & uVar31) != 0)) {
                              dVar178 = *(double *)
                                         ((long)pdVar37 +
                                         (lVar133 >> 0x1d) +
                                         (iVar89 + (int)lVar164) * lVar35 * 8 +
                                         (iVar88 + (int)lVar115) * lVar36 * 8 + lVar124 * 8) -
                                        dVar201;
                            }
                            adStack_3b8[iVar92 + lVar116] = dVar178;
                            lVar116 = lVar116 + 1;
                            lVar133 = lVar133 + 0x100000000;
                          } while (lVar116 != 3);
                          lVar164 = lVar164 + 1;
                          cVar152 = cVar152 + '\x03';
                          lVar133 = (long)iVar92 + 3;
                        } while (lVar164 != 2);
                        lVar115 = lVar115 + 1;
                        cVar144 = cVar144 + '\t';
                        lVar133 = (long)iVar92 + 3;
                      } while (lVar115 != 2);
                      pdVar118 = &local_408;
                      lVar115 = 0;
                      do {
                        lVar133 = 0;
                        auVar181 = _DAT_0077bb30;
                        do {
                          auVar184 = auVar181 ^ auVar84;
                          if (auVar184._4_4_ == -0x80000000 && auVar184._0_4_ < -0x7ffffffd) {
                            *(undefined8 *)((long)pdVar118 + lVar133) = 0;
                            *(undefined8 *)((long)pdVar118 + lVar133 + 0x18) = 0;
                          }
                          lVar164 = auVar181._8_8_;
                          auVar181._0_8_ = auVar181._0_8_ + 2;
                          auVar181._8_8_ = lVar164 + 2;
                          lVar133 = lVar133 + 0x30;
                        } while (lVar133 != 0x60);
                        lVar115 = lVar115 + 1;
                        pdVar118 = pdVar118 + 1;
                      } while (lVar115 != 3);
                      dVar200 = 0.0;
                      dVar205 = 0.0;
                      dVar191 = 0.0;
                      pLVar119 = &local_2d8.q.kstride;
                      lVar115 = 0;
                      dVar178 = local_3e8;
                      dVar202 = dStack_3e0;
                      dVar195 = local_3c8;
                      dVar199 = local_408;
                      dVar204 = local_400;
                      dVar189 = local_3f8;
                      do {
                        dVar179 = (double)*pLVar119;
                        pdVar118 = ((Array4<const_double> *)(pLVar119 + -2))->p;
                        dVar198 = (double)pLVar119[-1];
                        dVar178 = dVar178 + dVar198 * (double)pLVar119[-1];
                        dVar202 = dVar202 + dVar198 * (double)*pLVar119;
                        dVar195 = dVar195 + dVar179 * dVar179;
                        dVar196 = adStack_3b8[lVar115];
                        dVar199 = dVar199 + (double)pdVar118 * (double)pdVar118;
                        dVar200 = dVar200 + dVar196 * (double)pdVar118;
                        dVar204 = dVar204 + dVar198 * (double)pdVar118;
                        dVar205 = dVar205 + dVar196 * dVar198;
                        dVar189 = dVar189 + dVar179 * (double)pdVar118;
                        dVar191 = dVar191 + dVar196 * dVar179;
                        lVar115 = lVar115 + 1;
                        pLVar119 = pLVar119 + 3;
                      } while (lVar115 != 0x1b);
                      dVar179 = dVar178 * dVar195 - dVar202 * dVar202;
                      dVar196 = dVar195 * dVar204 - dVar189 * dVar202;
                      dVar198 = dVar195 * dVar205 - dVar191 * dVar202;
                      dVar195 = dVar204 * dVar202 - dVar178 * dVar189;
                      local_a28 = dVar189 * dVar195 + (dVar179 * dVar199 - dVar204 * dVar196);
                      local_9f8 = (dVar189 * (dVar205 * dVar202 - dVar178 * dVar191) +
                                  (dVar179 * dVar200 - dVar204 * dVar198)) / local_a28;
                      if ((((dVar203 == 1.0) && (!NAN(dVar203))) &&
                          (pdVar54[lVar107 + lVar163 + (lVar159 - lVar95)] == 1.0)) &&
                         (!NAN(pdVar54[lVar107 + lVar163 + (lVar159 - lVar95)]))) {
                        if ((pdVar54[lVar107 + lVar163 + ((lVar156 + 1) - lVar95)] == 1.0) &&
                           (!NAN(pdVar54[lVar107 + lVar163 + ((lVar156 + 1) - lVar95)]))) {
                          dVar194 = pdVar37[lVar112 + lVar101 + lVar124 + ((lVar156 + 1) - lVar162)]
                                    - dVar201;
                          dVar192 = (dVar201 - dVar190) + (dVar201 - dVar190);
                          dVar194 = dVar194 + dVar194;
                          dVar179 = (pdVar37[lVar112 + lVar101 + lVar124 + ((lVar156 + 1) - lVar162)
                                            ] - dVar190) * 0.5;
                          dVar185 = ABS(dVar192);
                          uVar175 = -(ulong)(0.0 < dVar179);
                          dVar179 = ABS(dVar179);
                          dVar182 = ABS(dVar194);
                          if (dVar185 <= dVar179) {
                            dVar179 = dVar185;
                          }
                          if (dVar179 <= dVar182) {
                            dVar182 = dVar179;
                          }
                          uVar180 = -(ulong)(0.0 < dVar192 * dVar194) & (ulong)dVar182;
                          local_9f8 = (double)(~uVar175 & (uVar180 ^ 0x8000000000000000) |
                                              uVar175 & uVar180);
                        }
                      }
                      dVar179 = dVar204 * dVar191 - dVar189 * dVar205;
                      dVar189 = (dVar189 * dVar179 + (dVar198 * dVar199 - dVar196 * dVar200)) /
                                local_a28;
                      if (((dVar203 == 1.0) && (!NAN(dVar203))) &&
                         ((pdVar54[lVar163 + lVar126 + lVar132] == 1.0 &&
                          (((!NAN(pdVar54[lVar163 + lVar126 + lVar132]) &&
                            (pdVar54[lVar163 + lVar135 + lVar132] == 1.0)) &&
                           (!NAN(pdVar54[lVar163 + lVar135 + lVar132]))))))) {
                        dVar182 = dVar201 - pdVar37[lVar113 + lVar101 + lVar124 + lVar136];
                        dVar185 = pdVar37[lVar127 + lVar101 + lVar124 + lVar136] - dVar201;
                        dVar182 = dVar182 + dVar182;
                        dVar185 = dVar185 + dVar185;
                        dVar189 = (pdVar37[lVar127 + lVar101 + lVar124 + lVar136] -
                                  pdVar37[lVar113 + lVar101 + lVar124 + lVar136]) * 0.5;
                        dVar198 = ABS(dVar182);
                        uVar175 = -(ulong)(0.0 < dVar189);
                        dVar189 = ABS(dVar189);
                        dVar196 = ABS(dVar185);
                        if (dVar198 <= dVar189) {
                          dVar189 = dVar198;
                        }
                        if (dVar189 <= dVar196) {
                          dVar196 = dVar189;
                        }
                        uVar180 = -(ulong)(0.0 < dVar182 * dVar185) & (ulong)dVar196;
                        dVar189 = (double)(~uVar175 & (uVar180 ^ 0x8000000000000000) |
                                          uVar175 & uVar180);
                      }
                      local_a28 = (dVar200 * dVar195 +
                                  (dVar199 * (dVar178 * dVar191 - dVar202 * dVar205) -
                                  dVar179 * dVar204)) / local_a28;
                      if (((dVar203 == 1.0) && (!NAN(dVar203))) &&
                         (((pdVar54[lVar107 + lVar132 + lVar102] == 1.0 &&
                           ((!NAN(pdVar54[lVar107 + lVar132 + lVar102]) &&
                            (pdVar54[lVar107 + lVar132 + lVar103] == 1.0)))) &&
                          (!NAN(pdVar54[lVar107 + lVar132 + lVar103]))))) {
                        dVar199 = dVar201 - pdVar37[lVar112 + lVar136 + lVar166 + lVar124];
                        dVar204 = pdVar37[lVar112 + lVar136 + lVar171 + lVar124] - dVar201;
                        dVar199 = dVar199 + dVar199;
                        dVar204 = dVar204 + dVar204;
                        dVar178 = (pdVar37[lVar112 + lVar136 + lVar171 + lVar124] -
                                  pdVar37[lVar112 + lVar136 + lVar166 + lVar124]) * 0.5;
                        dVar195 = ABS(dVar199);
                        uVar175 = -(ulong)(0.0 < dVar178);
                        dVar178 = ABS(dVar178);
                        dVar202 = ABS(dVar204);
                        if (dVar195 <= dVar178) {
                          dVar178 = dVar195;
                        }
                        if (dVar178 <= dVar202) {
                          dVar202 = dVar178;
                        }
                        uVar180 = -(ulong)(0.0 < dVar199 * dVar204) & (ulong)dVar202;
                        local_a28 = (double)(~uVar175 & (uVar180 ^ 0x8000000000000000) |
                                            uVar175 & uVar180);
                      }
                      dVar178 = dVar190;
                      if (dVar201 <= dVar190) {
                        dVar178 = dVar201;
                      }
                      if (dVar190 <= dVar201) {
                        dVar190 = dVar201;
                      }
                      iVar91 = 0;
                      iVar134 = 0;
                      iVar142 = 0;
                      iVar92 = 0;
                      uVar158 = 0xffffffff;
                      do {
                        uVar120 = uVar158 + 1;
                        uVar148 = 0xffffffff;
                        iVar161 = iVar91;
                        do {
                          uVar1 = uVar148 + 1;
                          iVar121 = 5;
                          do {
                            if (((uVar31 >> (iVar161 + iVar121 & 0x1fU) & 1) != 0) &&
                               ((iVar121 != 6 || uVar148 != 0) || uVar158 != 0)) {
                              iVar134 = iVar134 + (uint)((iVar121 - 5U & 0xfffffffd) == 0 &&
                                                        (uVar148 == 0 && uVar158 == 0));
                              iVar142 = iVar142 + (uint)((iVar121 == 6 && uVar158 == 0) &&
                                                        (uVar1 & 0xfffffffd) == 0);
                              iVar92 = iVar92 + (uint)((iVar121 == 6 && uVar148 == 0) &&
                                                      (uVar120 & 0xfffffffd) == 0);
                            }
                            iVar121 = iVar121 + 1;
                          } while (iVar121 != 8);
                          iVar161 = iVar161 + 3;
                          uVar148 = uVar1;
                        } while (uVar1 != 2);
                        iVar91 = iVar91 + 9;
                        uVar158 = uVar120;
                      } while (uVar120 != 2);
                      dVar202 = 2.0;
                      if ((uVar31 >> 0x15 & 1) != 0) {
                        lVar115 = -1;
                        cVar144 = '\b';
                        dVar195 = dVar201;
                        dVar202 = dVar201;
                        do {
                          lVar133 = 0;
                          cVar152 = cVar144;
                          do {
                            lVar164 = -1;
                            lVar136 = local_9b8;
                            do {
                              if ((((int)lVar133 != 0 || (int)lVar115 != 0) || (int)lVar164 != 0) &&
                                 ((1 << (cVar152 + (char)lVar164 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar199 = *(double *)
                                           ((long)pdVar37 +
                                           (lVar136 >> 0x1d) +
                                           (iVar89 + (int)lVar133) * lVar35 * 8 +
                                           (iVar88 + (int)lVar115) * lVar36 * 8 + lVar124 * 8);
                                dVar204 = dVar199;
                                if (dVar199 <= dVar202) {
                                  dVar204 = dVar202;
                                }
                                dVar202 = dVar204;
                                if (dVar199 < dVar195) {
                                  dVar195 = dVar199;
                                }
                              }
                              lVar164 = lVar164 + 1;
                              lVar136 = lVar136 + 0x100000000;
                            } while (lVar164 != 2);
                            cVar152 = cVar152 + '\x03';
                            bVar174 = lVar133 == 0;
                            lVar133 = lVar133 + 1;
                          } while (bVar174);
                          lVar115 = lVar115 + 1;
                          cVar144 = cVar144 + '\t';
                        } while (lVar115 != 2);
                        dVar199 = ((pdVar61[lVar128 + lVar104 + (lVar156 - lVar154) + lVar64] -
                                   dVar193) * local_a28 +
                                  (0.5 - dVar183) * dVar189 +
                                  (pdVar61[lVar128 + lVar104 + (lVar156 - lVar154)] - dVar186) *
                                  local_9f8 + dVar201) - dVar201;
                        if (dVar199 <= 1e-13) {
                          dVar202 = 1.0;
                          if ((dVar199 < -1e-13) &&
                             (dVar202 = (dVar195 - dVar201) / dVar199, 1.0 <= dVar202)) {
                            dVar202 = 1.0;
                          }
                        }
                        else {
                          dVar202 = (dVar202 - dVar201) / dVar199;
                          if (1.0 <= dVar202) {
                            dVar202 = 1.0;
                          }
                        }
                        if (2.0 <= dVar202) {
                          dVar202 = 2.0;
                        }
                      }
                      dVar195 = dVar202;
                      if ((short)uVar31 < 0) {
                        lVar115 = -1;
                        cVar144 = '\x05';
                        dVar195 = dVar201;
                        dVar199 = dVar201;
                        do {
                          lVar133 = -1;
                          cVar152 = cVar144;
                          do {
                            lVar164 = -1;
                            lVar136 = local_9b8;
                            do {
                              if ((((int)lVar133 != 0 || (int)lVar115 != 0) || (int)lVar164 != 0) &&
                                 ((1 << (cVar152 + (char)lVar164 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar204 = *(double *)
                                           ((long)pdVar37 +
                                           (lVar136 >> 0x1d) +
                                           (iVar89 + (int)lVar133) * lVar35 * 8 +
                                           (iVar88 + (int)lVar115) * lVar36 * 8 + lVar124 * 8);
                                dVar191 = dVar204;
                                if (dVar204 <= dVar195) {
                                  dVar191 = dVar195;
                                }
                                dVar195 = dVar191;
                                if (dVar204 < dVar199) {
                                  dVar199 = dVar204;
                                }
                              }
                              lVar164 = lVar164 + 1;
                              lVar136 = lVar136 + 0x100000000;
                            } while (lVar164 != 2);
                            cVar152 = cVar152 + '\x03';
                            bVar174 = lVar133 != 0;
                            lVar133 = lVar133 + 1;
                          } while (bVar174);
                          lVar115 = lVar115 + 1;
                          cVar144 = cVar144 + '\t';
                        } while (lVar115 != 2);
                        dVar204 = ((pdVar61[lVar129 + lVar104 + (lVar156 - lVar154) + lVar64] -
                                   dVar193) * local_a28 +
                                  (((pdVar61[lVar129 + lVar104 + (lVar156 - lVar154)] - dVar186) *
                                    local_9f8 + dVar201) - (dVar183 + 0.5) * dVar189)) - dVar201;
                        if (dVar204 <= 1e-13) {
                          dVar195 = 1.0;
                          if ((dVar204 < -1e-13) &&
                             (dVar195 = (dVar199 - dVar201) / dVar204, 1.0 <= dVar195)) {
                            dVar195 = 1.0;
                          }
                        }
                        else {
                          dVar195 = (dVar195 - dVar201) / dVar204;
                          if (1.0 <= dVar195) {
                            dVar195 = 1.0;
                          }
                        }
                        if (dVar202 <= dVar195) {
                          dVar195 = dVar202;
                        }
                      }
                      dVar202 = dVar195;
                      if ((uVar31 >> 0x13 & 1) != 0) {
                        lVar115 = (long)((iVar90 - iVar21) + 1);
                        lVar133 = -1;
                        cVar144 = '\x06';
                        dVar199 = dVar201;
                        dVar202 = dVar201;
                        do {
                          lVar136 = -1;
                          cVar152 = cVar144;
                          do {
                            lVar116 = 0;
                            lVar164 = lVar146;
                            do {
                              if ((((int)lVar136 != 0 || (int)lVar133 != 0) || (int)lVar116 != 0) &&
                                 ((1 << (cVar152 + (char)lVar116 & 0x1fU) & uVar31) != 0)) {
                                dVar204 = *(double *)
                                           ((long)pdVar37 +
                                           (lVar164 >> 0x1d) +
                                           (iVar89 + (int)lVar136) * lVar35 * 8 +
                                           (iVar88 + (int)lVar133) * lVar36 * 8 + lVar124 * 8);
                                dVar191 = dVar204;
                                if (dVar204 <= dVar202) {
                                  dVar191 = dVar202;
                                }
                                dVar202 = dVar191;
                                if (dVar204 < dVar199) {
                                  dVar199 = dVar204;
                                }
                              }
                              lVar116 = lVar116 + 1;
                              lVar164 = lVar164 + 0x100000000;
                            } while (lVar116 == 1);
                            lVar136 = lVar136 + 1;
                            cVar152 = cVar152 + '\x03';
                          } while (lVar136 != 2);
                          lVar133 = lVar133 + 1;
                          cVar144 = cVar144 + '\t';
                        } while (lVar133 != 2);
                        dVar204 = ((pdVar57[lVar110 + lVar99 + lVar115 + lVar60] - dVar193) *
                                   local_a28 +
                                  (pdVar57[lVar110 + lVar99 + lVar115] - dVar183) * dVar189 +
                                  (0.5 - dVar186) * local_9f8 + dVar201) - dVar201;
                        if (dVar204 <= 1e-13) {
                          dVar202 = 1.0;
                          if ((dVar204 < -1e-13) &&
                             (dVar202 = (dVar199 - dVar201) / dVar204, 1.0 <= dVar202)) {
                            dVar202 = 1.0;
                          }
                        }
                        else {
                          dVar202 = (dVar202 - dVar201) / dVar204;
                          if (1.0 <= dVar202) {
                            dVar202 = 1.0;
                          }
                        }
                        if (dVar195 <= dVar202) {
                          dVar202 = dVar195;
                        }
                      }
                      lVar115 = -1;
                      cVar144 = '\x05';
                      dVar195 = dVar201;
                      dVar199 = dVar201;
                      do {
                        lVar133 = -1;
                        cVar152 = cVar144;
                        do {
                          lVar164 = -1;
                          lVar136 = local_9b8;
                          do {
                            if ((((int)lVar133 != 0 || (int)lVar115 != 0) || (int)lVar164 != 0) &&
                               ((1 << (cVar152 + (char)lVar164 + 1U & 0x1f) & uVar31) != 0)) {
                              dVar204 = *(double *)
                                         ((long)pdVar37 +
                                         (lVar136 >> 0x1d) +
                                         (iVar89 + (int)lVar133) * lVar35 * 8 +
                                         (iVar88 + (int)lVar115) * lVar36 * 8 + lVar124 * 8);
                              dVar191 = dVar204;
                              if (dVar204 <= dVar199) {
                                dVar191 = dVar199;
                              }
                              dVar199 = dVar191;
                              if (dVar204 < dVar195) {
                                dVar195 = dVar204;
                              }
                            }
                            lVar164 = lVar164 + 1;
                            lVar136 = lVar136 + 0x100000000;
                          } while (lVar164 != 1);
                          lVar133 = lVar133 + 1;
                          cVar152 = cVar152 + '\x03';
                        } while (lVar133 != 2);
                        lVar115 = lVar115 + 1;
                        cVar144 = cVar144 + '\t';
                      } while (lVar115 != 2);
                      dVar204 = ((dVar197 - dVar193) * local_a28 +
                                (dVar177 - dVar183) * dVar189 +
                                (dVar201 - (dVar186 + 0.5) * local_9f8)) - dVar201;
                      if (dVar204 <= 1e-13) {
                        dVar199 = 1.0;
                        if ((dVar204 < -1e-13) &&
                           (dVar199 = (dVar195 - dVar201) / dVar204, 1.0 <= dVar199)) {
                          dVar199 = 1.0;
                        }
                      }
                      else {
                        dVar199 = (dVar199 - dVar201) / dVar204;
                        if (1.0 <= dVar199) {
                          dVar199 = 1.0;
                        }
                      }
                      if (dVar202 <= dVar199) {
                        dVar199 = dVar202;
                      }
                      dVar202 = dVar199;
                      if ((uVar31 >> 0x1b & 1) != 0) {
                        cVar144 = '\x0e';
                        lVar115 = 0;
                        dVar195 = dVar201;
                        dVar202 = dVar201;
                        do {
                          lVar133 = -1;
                          cVar152 = cVar144;
                          do {
                            lVar164 = -1;
                            lVar136 = local_9b8;
                            do {
                              if ((((int)lVar133 != 0 || (int)lVar115 != 0) || (int)lVar164 != 0) &&
                                 ((1 << (cVar152 + (char)lVar164 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar204 = *(double *)
                                           ((long)pdVar37 +
                                           (lVar136 >> 0x1d) +
                                           (iVar89 + (int)lVar133) * lVar35 * 8 +
                                           (iVar88 + (int)lVar115) * lVar36 * 8 + lVar124 * 8);
                                dVar191 = dVar204;
                                if (dVar204 <= dVar202) {
                                  dVar191 = dVar202;
                                }
                                dVar202 = dVar191;
                                if (dVar204 < dVar195) {
                                  dVar195 = dVar204;
                                }
                              }
                              lVar164 = lVar164 + 1;
                              lVar136 = lVar136 + 0x100000000;
                            } while (lVar164 != 2);
                            lVar133 = lVar133 + 1;
                            cVar152 = cVar152 + '\x03';
                          } while (lVar133 != 2);
                          cVar144 = cVar144 + '\t';
                          bVar174 = lVar115 == 0;
                          lVar115 = lVar115 + 1;
                        } while (bVar174);
                        dVar204 = ((0.5 - dVar193) * local_a28 +
                                  (pdVar65[lVar130 + lVar167 + (lVar156 - lVar155) + lVar68] -
                                  dVar183) * dVar189 +
                                  (pdVar65[lVar130 + lVar167 + (lVar156 - lVar155)] - dVar186) *
                                  local_9f8 + dVar201) - dVar201;
                        if (dVar204 <= 1e-13) {
                          dVar202 = 1.0;
                          if ((dVar204 < -1e-13) &&
                             (dVar202 = (dVar195 - dVar201) / dVar204, 1.0 <= dVar202)) {
                            dVar202 = 1.0;
                          }
                        }
                        else {
                          dVar202 = (dVar202 - dVar201) / dVar204;
                          if (1.0 <= dVar202) {
                            dVar202 = 1.0;
                          }
                        }
                        if (dVar199 <= dVar202) {
                          dVar202 = dVar199;
                        }
                      }
                      dVar195 = dVar202;
                      if ((uVar31 >> 9 & 1) != 0) {
                        cVar144 = '\x05';
                        lVar115 = -1;
                        dVar199 = dVar201;
                        dVar195 = dVar201;
                        do {
                          lVar133 = -1;
                          cVar152 = cVar144;
                          do {
                            lVar164 = -1;
                            lVar136 = local_9b8;
                            do {
                              if ((((int)lVar133 != 0 || (int)lVar115 != 0) || (int)lVar164 != 0) &&
                                 ((1 << (cVar152 + (char)lVar164 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar204 = *(double *)
                                           ((long)pdVar37 +
                                           (lVar136 >> 0x1d) +
                                           (iVar89 + (int)lVar133) * lVar35 * 8 +
                                           (iVar88 + (int)lVar115) * lVar36 * 8 + lVar124 * 8);
                                dVar191 = dVar204;
                                if (dVar204 <= dVar195) {
                                  dVar191 = dVar195;
                                }
                                dVar195 = dVar191;
                                if (dVar204 < dVar199) {
                                  dVar199 = dVar204;
                                }
                              }
                              lVar164 = lVar164 + 1;
                              lVar136 = lVar136 + 0x100000000;
                            } while (lVar164 != 2);
                            lVar133 = lVar133 + 1;
                            cVar152 = cVar152 + '\x03';
                          } while (lVar133 != 2);
                          cVar144 = cVar144 + '\t';
                          bVar174 = lVar115 != 0;
                          lVar115 = lVar115 + 1;
                        } while (bVar174);
                        dVar204 = (((pdVar65[lVar130 + lVar168 + (lVar156 - lVar155) + lVar68] -
                                    dVar183) * dVar189 +
                                   (pdVar65[lVar130 + lVar168 + (lVar156 - lVar155)] - dVar186) *
                                   local_9f8 + dVar201) - (dVar193 + 0.5) * local_a28) - dVar201;
                        if (dVar204 <= 1e-13) {
                          dVar195 = 1.0;
                          if ((dVar204 < -1e-13) &&
                             (dVar195 = (dVar199 - dVar201) / dVar204, 1.0 <= dVar195)) {
                            dVar195 = 1.0;
                          }
                        }
                        else {
                          dVar195 = (dVar195 - dVar201) / dVar204;
                          if (1.0 <= dVar195) {
                            dVar195 = 1.0;
                          }
                        }
                        if (dVar202 <= dVar195) {
                          dVar195 = dVar202;
                        }
                      }
                      dVar202 = 0.0;
                      if (1 < iVar134) {
                        dVar202 = dVar195;
                      }
                      dVar199 = 0.0;
                      if (1 < iVar142) {
                        dVar199 = dVar195;
                      }
                      dVar204 = 0.0;
                      if (1 < iVar92) {
                        dVar204 = dVar195;
                      }
                      if (((((dVar203 == 1.0) && (!NAN(dVar203))) &&
                           (pdVar54[lVar107 + lVar163 + (lVar159 - lVar95)] == 1.0)) &&
                          ((!NAN(pdVar54[lVar107 + lVar163 + (lVar159 - lVar95)]) &&
                           (pdVar54[lVar107 + lVar163 + ((iVar90 - iVar18) + 1)] == 1.0)))) &&
                         (!NAN(pdVar54[lVar107 + lVar163 + ((iVar90 - iVar18) + 1)]))) {
                        dVar202 = 1.0;
                      }
                      if (((dVar203 == 1.0) && (!NAN(dVar203))) &&
                         ((pdVar54[lVar163 + lVar131 + lVar132] == 1.0 &&
                          (((!NAN(pdVar54[lVar163 + lVar131 + lVar132]) &&
                            (pdVar54[lVar163 + lVar114 + lVar132] == 1.0)) &&
                           (!NAN(pdVar54[lVar163 + lVar114 + lVar132]))))))) {
                        dVar199 = 1.0;
                      }
                      if ((((dVar203 == 1.0) && (!NAN(dVar203))) &&
                          ((pdVar54[lVar107 + lVar132 + lVar125] == 1.0 &&
                           ((!NAN(pdVar54[lVar107 + lVar132 + lVar125]) &&
                            (pdVar54[lVar107 + lVar132 + lVar105] == 1.0)))))) &&
                         (!NAN(pdVar54[lVar107 + lVar132 + lVar105]))) {
                        dVar204 = 1.0;
                      }
                      dVar177 = (dVar197 - dVar193) * local_a28 * dVar204 +
                                (dVar177 - dVar183) * dVar189 * dVar199 +
                                (-0.5 - dVar186) * local_9f8 * dVar202 + dVar201;
                      if (dVar177 <= dVar190) {
                        dVar190 = dVar177;
                      }
                      if (dVar178 <= dVar190) {
                        dVar178 = dVar190;
                      }
                      dVar178 = pdVar39[lVar109 + lVar98 + (lVar156 - lVar140)] * dVar176 * -0.5 *
                                local_9f8 * dVar202 + dVar178;
                    }
                    else {
                      if ((pdVar54[lVar107 + lVar163 + ((lVar156 + -1) - lVar95)] != 1.0) ||
                         (NAN(pdVar54[lVar107 + lVar163 + ((lVar156 + -1) - lVar95)])))
                      goto LAB_0040cb78;
                      if ((((pdVar54[lVar107 + lVar163 + ((lVar156 + -2) - lVar95)] != 1.0) ||
                           (NAN(pdVar54[lVar107 + lVar163 + ((lVar156 + -2) - lVar95)]))) ||
                          (pdVar54[lVar107 + lVar163 + lVar132 + 1] != 1.0)) ||
                         (NAN(pdVar54[lVar107 + lVar163 + lVar132 + 1]))) {
LAB_0040f4f0:
                        if ((pdVar54[lVar107 + lVar163 + lVar132 + 1] != 1.0) ||
                           (NAN(pdVar54[lVar107 + lVar163 + lVar132 + 1]))) goto LAB_0040cb78;
                        dVar178 = pdVar37[lVar108 + lVar97 + lVar124 + (lVar156 - lVar162)];
                        dVar177 = (pdVar37 + lVar108 + lVar97 + lVar124 + (lVar156 - lVar162))[1];
                        dVar183 = dVar178 - pdVar37[lVar108 + lVar97 + lVar124 + ((lVar156 + -1) -
                                                                                 lVar162)];
                        dVar193 = dVar177 - dVar178;
                        dVar183 = dVar183 + dVar183;
                        dVar193 = dVar193 + dVar193;
                        dVar177 = (dVar177 -
                                  pdVar37[lVar108 + lVar97 + lVar124 + ((lVar156 + -1) - lVar162)])
                                  * 0.5;
                        dVar186 = ABS(dVar183);
                        uVar175 = -(ulong)(0.0 < dVar177);
                        dVar177 = ABS(dVar177);
                        dVar197 = ABS(dVar193);
                        if (dVar186 <= dVar177) {
                          dVar177 = dVar186;
                        }
                        if (dVar177 <= dVar197) {
                          dVar197 = dVar177;
                        }
                        uVar180 = -(ulong)(0.0 < dVar183 * dVar193) & (ulong)dVar197;
                        dVar178 = (double)(~uVar175 & (uVar180 ^ 0x8000000000000000) |
                                          uVar175 & uVar180) *
                                  (-1.0 - pdVar39[lVar109 + lVar98 + (lVar156 - lVar140)] * dVar176)
                                  * 0.5 + dVar178;
                      }
                      else {
                        if ((pdVar54[lVar107 + lVar163 + ((lVar156 + 2) - lVar95)] != 1.0) ||
                           (NAN(pdVar54[lVar107 + lVar163 + ((lVar156 + 2) - lVar95)])))
                        goto LAB_0040f4f0;
                        dVar178 = pdVar37[lVar108 + lVar97 + lVar124 + (lVar156 - lVar162)];
                        dVar177 = (pdVar37 + lVar108 + lVar97 + lVar124 + (lVar156 - lVar162))[1];
                        dVar197 = (pdVar37 + lVar108 + lVar97 + lVar124 + ((lVar156 + -2) - lVar162)
                                  )[1];
                        dVar193 = dVar197 - pdVar37[lVar108 + lVar97 + lVar124 + ((lVar156 + -2) -
                                                                                 lVar162)];
                        dVar197 = dVar178 - dVar197;
                        dVar183 = 0.0;
                        dVar186 = 0.0;
                        if (0.0 <= dVar197 * dVar193) {
                          dVar186 = ABS(dVar197);
                          if (ABS(dVar193) <= ABS(dVar197)) {
                            dVar186 = ABS(dVar193);
                          }
                          dVar186 = dVar186 + dVar186;
                        }
                        dVar201 = dVar177 - dVar178;
                        dVar177 = pdVar37[lVar108 + lVar97 + lVar124 + ((lVar156 + 2) - lVar162)] -
                                  dVar177;
                        dVar190 = (dVar201 + dVar177) * 0.5;
                        if (0.0 <= dVar177 * dVar201) {
                          dVar183 = ABS(dVar177);
                          if (ABS(dVar201) <= ABS(dVar177)) {
                            dVar183 = ABS(dVar201);
                          }
                          dVar183 = dVar183 + dVar183;
                        }
                        dVar202 = (dVar197 + dVar201) * 0.5;
                        dVar177 = 0.0;
                        if (0.0 <= dVar197 * dVar201) {
                          dVar177 = ABS(dVar201);
                          if (ABS(dVar197) <= ABS(dVar201)) {
                            dVar177 = ABS(dVar197);
                          }
                          dVar177 = dVar177 + dVar177;
                        }
                        dVar193 = (dVar197 + dVar193) * 0.5;
                        dVar197 = ABS(dVar193);
                        if (dVar186 <= dVar197) {
                          dVar197 = dVar186;
                        }
                        dVar186 = ABS(dVar190);
                        if (dVar183 <= dVar186) {
                          dVar186 = dVar183;
                        }
                        dVar197 = ABS(dVar202 * 1.3333333333333333 +
                                      (dVar186 * (double)((ulong)dVar190 & 0x8000000000000000 |
                                                         0x3ff0000000000000) +
                                      dVar197 * (double)((ulong)dVar193 & 0x8000000000000000 |
                                                        0x3ff0000000000000)) * -0.16666666666666666)
                        ;
                        if (dVar177 <= dVar197) {
                          dVar197 = dVar177;
                        }
                        dVar178 = dVar197 * (double)((ulong)dVar202 & 0x8000000000000000 |
                                                    0x3ff0000000000000) *
                                  (-1.0 - pdVar39[lVar109 + lVar98 + (lVar156 - lVar140)] * dVar176)
                                  * 0.5 + dVar178;
                      }
                    }
                    lVar132 = lVar156 + -1;
                    lVar159 = lVar132 - lVar95;
                    dVar197 = pdVar54[lVar107 + lVar159 + lVar163];
                    if ((dVar197 == 1.0) && (!NAN(dVar197))) {
                      iVar92 = iVar90 + -2;
                      dVar177 = pdVar54[lVar107 + lVar163 + (iVar92 - iVar18)];
                      if ((dVar177 == 1.0) &&
                         (((!NAN(dVar177) && (dVar203 == 1.0)) && (!NAN(dVar203))))) {
                        if ((pdVar54[lVar107 + lVar163 + ((iVar90 + -3) - iVar18)] == 1.0) &&
                           (!NAN(pdVar54[lVar107 + lVar163 + ((iVar90 + -3) - iVar18)]))) {
                          if ((pdVar54[lVar107 + lVar163 + ((iVar90 + 1) - iVar18)] == 1.0) &&
                             (!NAN(pdVar54[lVar107 + lVar163 + ((iVar90 + 1) - iVar18)]))) {
                            dVar177 = pdVar37[lVar108 + lVar97 + lVar124 + (lVar132 - lVar162)];
                            dVar203 = (pdVar37 + lVar108 + lVar97 + lVar124 + (lVar132 - lVar162))
                                      [1];
                            dVar183 = dVar177 - pdVar37[lVar108 + lVar97 + lVar124 + (int)(iVar92 - 
                                                  uVar12)];
                            dVar193 = pdVar37[lVar108 + lVar97 + lVar124 + (int)(iVar92 - uVar12)] -
                                      pdVar37[lVar108 + lVar97 + lVar124 + (int)((iVar90 + -3) -
                                                                                uVar12)];
                            dVar186 = 0.0;
                            dVar197 = 0.0;
                            if (0.0 <= dVar183 * dVar193) {
                              dVar197 = ABS(dVar183);
                              if (ABS(dVar193) <= ABS(dVar183)) {
                                dVar197 = ABS(dVar193);
                              }
                              dVar197 = dVar197 + dVar197;
                            }
                            dVar201 = dVar203 - dVar177;
                            dVar203 = pdVar37[lVar108 + lVar97 + lVar124 + (int)((iVar90 + 1) -
                                                                                uVar12)] - dVar203;
                            dVar190 = (dVar201 + dVar203) * 0.5;
                            if (0.0 <= dVar203 * dVar201) {
                              dVar186 = ABS(dVar203);
                              if (ABS(dVar201) <= ABS(dVar203)) {
                                dVar186 = ABS(dVar201);
                              }
                              dVar186 = dVar186 + dVar186;
                            }
                            dVar202 = (dVar183 + dVar201) * 0.5;
                            dVar203 = 0.0;
                            if (0.0 <= dVar183 * dVar201) {
                              dVar203 = ABS(dVar201);
                              if (ABS(dVar183) <= ABS(dVar201)) {
                                dVar203 = ABS(dVar183);
                              }
                              dVar203 = dVar203 + dVar203;
                            }
                            dVar193 = (dVar183 + dVar193) * 0.5;
                            dVar183 = ABS(dVar193);
                            if (dVar197 <= dVar183) {
                              dVar183 = dVar197;
                            }
                            dVar197 = ABS(dVar190);
                            if (dVar186 <= dVar197) {
                              dVar197 = dVar186;
                            }
                            dVar197 = ABS(dVar202 * 1.3333333333333333 +
                                          (dVar197 * (double)((ulong)dVar190 & 0x8000000000000000 |
                                                             0x3ff0000000000000) +
                                          dVar183 * (double)((ulong)dVar193 & 0x8000000000000000 |
                                                            0x3ff0000000000000)) *
                                          -0.16666666666666666);
                            if (dVar203 <= dVar197) {
                              dVar197 = dVar203;
                            }
                            dVar177 = dVar197 * (double)((ulong)dVar202 & 0x8000000000000000 |
                                                        0x3ff0000000000000) *
                                      (1.0 - pdVar39[lVar109 + lVar98 + (lVar132 - lVar140)] *
                                             dVar176) * 0.5 + dVar177;
                            goto LAB_0041002d;
                          }
                        }
                      }
                      if (((dVar203 == 1.0) && (!NAN(dVar203))) &&
                         ((dVar177 == 1.0 && (!NAN(dVar177))))) {
                        dVar177 = pdVar37[lVar108 + lVar97 + lVar124 + (lVar132 - lVar162)];
                        dVar203 = (pdVar37 + lVar108 + lVar97 + lVar124 + (lVar132 - lVar162))[1];
                        dVar186 = dVar177 - pdVar37[lVar108 + lVar97 + lVar124 + (int)(iVar92 - 
                                                  uVar12)];
                        dVar183 = dVar203 - dVar177;
                        dVar186 = dVar186 + dVar186;
                        dVar183 = dVar183 + dVar183;
                        dVar203 = (dVar203 -
                                  pdVar37[lVar108 + lVar97 + lVar124 + (int)(iVar92 - uVar12)]) *
                                  0.5;
                        dVar193 = ABS(dVar186);
                        uVar175 = -(ulong)(0.0 < dVar203);
                        dVar203 = ABS(dVar203);
                        dVar197 = ABS(dVar183);
                        if (dVar193 <= dVar203) {
                          dVar203 = dVar193;
                        }
                        if (dVar203 <= dVar197) {
                          dVar197 = dVar203;
                        }
                        uVar180 = -(ulong)(0.0 < dVar186 * dVar183) & (ulong)dVar197;
                        dVar177 = (double)(~uVar175 & (uVar180 ^ 0x8000000000000000) |
                                          uVar175 & uVar180) *
                                  (1.0 - pdVar39[lVar109 + lVar98 + (lVar132 - lVar140)] * dVar176)
                                  * 0.5 + dVar177;
                        goto LAB_0041002d;
                      }
                    }
                    dVar186 = pdVar57[lVar110 + lVar99 + (lVar156 - lVar153)];
                    dVar183 = pdVar57[lVar110 + lVar99 + (lVar156 - lVar153) + lVar60];
                    pdVar118 = pdVar53 + (iVar157 - iVar160) * lVar33 +
                                         (iVar139 - iVar165) * lVar32 + (long)((int)lVar132 - iVar5)
                    ;
                    dVar193 = *pdVar118;
                    dVar190 = pdVar118[lVar34];
                    dVar201 = pdVar118[lVar34 * 2];
                    lVar133 = (long)(int)((int)lVar132 - uVar12);
                    dVar202 = pdVar37[lVar112 + lVar101 + lVar124 + (lVar156 - lVar162)];
                    dVar195 = pdVar37[lVar112 + lVar133 + lVar101 + lVar124];
                    uVar31 = pEVar50[lVar145 + lVar106 + (lVar132 - lVar149)].flag;
                    lVar136 = -1;
                    cVar144 = '\x05';
                    lVar115 = 0;
                    do {
                      iVar92 = (int)lVar136;
                      lVar164 = -1;
                      cVar152 = cVar144;
                      do {
                        iVar91 = (int)lVar164;
                        iVar134 = (int)lVar115;
                        ppdVar117 = &local_2d8.q.p + (long)iVar134 * 3;
                        lVar115 = -1;
                        do {
                          iVar142 = (int)lVar115;
                          if (((iVar91 == 0 && iVar92 == 0) && iVar142 == 0) ||
                             ((1 << (cVar152 + (char)lVar115 + 1U & 0x1f) & uVar31) == 0)) {
                            *ppdVar117 = (double *)0x0;
                            ppdVar117[1] = (double *)0x0;
                            ppdVar117[2] = (double *)0x0;
                          }
                          else {
                            pdVar118 = pdVar53 + ((iVar157 - iVar160) + iVar92) * lVar33 +
                                                 ((iVar139 - iVar165) + iVar91) * lVar32 +
                                                 (long)(iVar82 + iVar142 + 1);
                            dVar177 = pdVar118[lVar34];
                            *ppdVar117 = (double *)((*pdVar118 + (double)iVar142) - dVar193);
                            ppdVar117[1] = (double *)((dVar177 + (double)iVar91) - dVar190);
                            ppdVar117[2] = (double *)
                                           ((pdVar118[lVar34 * 2] + (double)iVar92) - dVar201);
                          }
                          lVar115 = lVar115 + 1;
                          ppdVar117 = ppdVar117 + 3;
                        } while (lVar115 != 2);
                        lVar164 = lVar164 + 1;
                        cVar152 = cVar152 + '\x03';
                        lVar115 = (long)iVar134 + 3;
                      } while (lVar164 != 2);
                      lVar136 = lVar136 + 1;
                      cVar144 = cVar144 + '\t';
                      lVar115 = (long)iVar134 + 3;
                    } while (lVar136 != 2);
                    lVar115 = -1;
                    cVar144 = '\x05';
                    lVar136 = 0;
                    do {
                      lVar164 = -1;
                      cVar152 = cVar144;
                      do {
                        iVar92 = (int)lVar136;
                        lVar136 = 0;
                        do {
                          dVar177 = 0.0;
                          if (((int)lVar136 != 1 || ((int)lVar164 != 0 || (int)lVar115 != 0)) &&
                             ((1 << (cVar152 + (char)lVar136 & 0x1fU) & uVar31) != 0)) {
                            dVar177 = pdVar37[lVar124 + (iVar88 + (int)lVar115) * lVar36 +
                                                        (iVar89 + (int)lVar164) * lVar35 +
                                                        (long)(iVar83 + (int)lVar136)] - dVar195;
                          }
                          adStack_3b8[iVar92 + lVar136] = dVar177;
                          lVar136 = lVar136 + 1;
                        } while (lVar136 != 3);
                        lVar164 = lVar164 + 1;
                        cVar152 = cVar152 + '\x03';
                        lVar136 = (long)iVar92 + 3;
                      } while (lVar164 != 2);
                      lVar115 = lVar115 + 1;
                      cVar144 = cVar144 + '\t';
                      lVar136 = (long)iVar92 + 3;
                    } while (lVar115 != 2);
                    pdVar118 = &local_408;
                    lVar115 = 0;
                    do {
                      lVar136 = 0;
                      auVar184 = _DAT_0077bb30;
                      do {
                        auVar181 = auVar184 ^ auVar84;
                        if (auVar181._4_4_ == -0x80000000 && auVar181._0_4_ < -0x7ffffffd) {
                          *(undefined8 *)((long)pdVar118 + lVar136) = 0;
                          *(undefined8 *)((long)pdVar118 + lVar136 + 0x18) = 0;
                        }
                        lVar164 = auVar184._8_8_;
                        auVar184._0_8_ = auVar184._0_8_ + 2;
                        auVar184._8_8_ = lVar164 + 2;
                        lVar136 = lVar136 + 0x30;
                      } while (lVar136 != 0x60);
                      lVar115 = lVar115 + 1;
                      pdVar118 = pdVar118 + 1;
                    } while (lVar115 != 3);
                    dVar179 = 0.0;
                    dVar196 = 0.0;
                    dVar199 = 0.0;
                    pLVar119 = &local_2d8.q.kstride;
                    lVar115 = 0;
                    dVar204 = local_3c8;
                    dVar189 = local_408;
                    dVar191 = local_400;
                    dVar177 = local_3f8;
                    dVar200 = local_3e8;
                    dVar205 = dStack_3e0;
                    do {
                      dVar198 = (double)*pLVar119;
                      pdVar118 = ((Array4<const_double> *)(pLVar119 + -2))->p;
                      dVar185 = (double)pLVar119[-1];
                      dVar200 = dVar200 + dVar185 * (double)pLVar119[-1];
                      dVar205 = dVar205 + dVar185 * (double)*pLVar119;
                      dVar204 = dVar204 + dVar198 * dVar198;
                      dVar182 = adStack_3b8[lVar115];
                      dVar189 = dVar189 + (double)pdVar118 * (double)pdVar118;
                      dVar179 = dVar179 + dVar182 * (double)pdVar118;
                      dVar191 = dVar191 + dVar185 * (double)pdVar118;
                      dVar196 = dVar196 + dVar182 * dVar185;
                      dVar177 = dVar177 + dVar198 * (double)pdVar118;
                      dVar199 = dVar199 + dVar182 * dVar198;
                      lVar115 = lVar115 + 1;
                      pLVar119 = pLVar119 + 3;
                    } while (lVar115 != 0x1b);
                    dVar182 = dVar200 * dVar204 - dVar205 * dVar205;
                    dVar198 = dVar204 * dVar191 - dVar177 * dVar205;
                    dVar204 = dVar204 * dVar196 - dVar199 * dVar205;
                    dVar185 = dVar191 * dVar205 - dVar200 * dVar177;
                    local_a28 = dVar177 * dVar185 + (dVar182 * dVar189 - dVar191 * dVar198);
                    local_968 = (dVar177 * (dVar196 * dVar205 - dVar200 * dVar199) +
                                (dVar182 * dVar179 - dVar191 * dVar204)) / local_a28;
                    if ((((dVar197 == 1.0) && (!NAN(dVar197))) && (dVar203 == 1.0)) &&
                       (!NAN(dVar203))) {
                      if ((pdVar54[lVar107 + lVar163 + ((lVar156 + -2) - lVar95)] == 1.0) &&
                         (!NAN(pdVar54[lVar107 + lVar163 + ((lVar156 + -2) - lVar95)]))) {
                        dVar188 = dVar195 - pdVar37[lVar112 + lVar101 + lVar124 + ((lVar156 + -2) -
                                                                                  lVar162)];
                        dVar187 = (dVar202 - dVar195) + (dVar202 - dVar195);
                        dVar188 = dVar188 + dVar188;
                        dVar182 = (dVar202 -
                                  pdVar37[lVar112 + lVar101 + lVar124 + ((lVar156 + -2) - lVar162)])
                                  * 0.5;
                        dVar194 = ABS(dVar188);
                        uVar175 = -(ulong)(0.0 < dVar182);
                        dVar182 = ABS(dVar182);
                        dVar192 = ABS(dVar187);
                        if (dVar194 <= dVar182) {
                          dVar182 = dVar194;
                        }
                        if (dVar182 <= dVar192) {
                          dVar192 = dVar182;
                        }
                        uVar180 = -(ulong)(0.0 < dVar188 * dVar187) & (ulong)dVar192;
                        local_968 = (double)(~uVar175 & (uVar180 ^ 0x8000000000000000) |
                                            uVar175 & uVar180);
                      }
                    }
                    dVar182 = dVar191 * dVar199 - dVar177 * dVar196;
                    local_9f8 = (dVar177 * dVar182 + (dVar204 * dVar189 - dVar198 * dVar179)) /
                                local_a28;
                    if (((dVar197 == 1.0) && (!NAN(dVar197))) &&
                       ((pdVar54[lVar163 + lVar126 + lVar159] == 1.0 &&
                        (((!NAN(pdVar54[lVar163 + lVar126 + lVar159]) &&
                          (pdVar54[lVar163 + lVar135 + lVar159] == 1.0)) &&
                         (!NAN(pdVar54[lVar163 + lVar135 + lVar159]))))))) {
                      dVar192 = dVar195 - pdVar37[lVar113 + lVar101 + lVar124 + lVar133];
                      dVar194 = pdVar37[lVar127 + lVar101 + lVar124 + lVar133] - dVar195;
                      dVar192 = dVar192 + dVar192;
                      dVar194 = dVar194 + dVar194;
                      dVar177 = (pdVar37[lVar127 + lVar101 + lVar124 + lVar133] -
                                pdVar37[lVar113 + lVar101 + lVar124 + lVar133]) * 0.5;
                      dVar198 = ABS(dVar192);
                      uVar175 = -(ulong)(0.0 < dVar177);
                      dVar177 = ABS(dVar177);
                      dVar204 = ABS(dVar194);
                      if (dVar198 <= dVar177) {
                        dVar177 = dVar198;
                      }
                      if (dVar177 <= dVar204) {
                        dVar204 = dVar177;
                      }
                      uVar180 = -(ulong)(0.0 < dVar192 * dVar194) & (ulong)dVar204;
                      local_9f8 = (double)(~uVar175 & (uVar180 ^ 0x8000000000000000) |
                                          uVar175 & uVar180);
                    }
                    local_a28 = (dVar179 * dVar185 +
                                (dVar189 * (dVar200 * dVar199 - dVar205 * dVar196) -
                                dVar182 * dVar191)) / local_a28;
                    if (((dVar197 == 1.0) && (!NAN(dVar197))) &&
                       (((pdVar54[lVar107 + lVar159 + lVar102] == 1.0 &&
                         ((!NAN(pdVar54[lVar107 + lVar159 + lVar102]) &&
                          (pdVar54[lVar107 + lVar159 + lVar103] == 1.0)))) &&
                        (!NAN(pdVar54[lVar107 + lVar159 + lVar103]))))) {
                      dVar189 = dVar195 - pdVar37[lVar112 + lVar133 + lVar166 + lVar124];
                      dVar191 = pdVar37[lVar112 + lVar133 + lVar171 + lVar124] - dVar195;
                      dVar189 = dVar189 + dVar189;
                      dVar191 = dVar191 + dVar191;
                      dVar177 = (pdVar37[lVar112 + lVar133 + lVar171 + lVar124] -
                                pdVar37[lVar112 + lVar133 + lVar166 + lVar124]) * 0.5;
                      dVar204 = ABS(dVar189);
                      uVar175 = -(ulong)(0.0 < dVar177);
                      dVar177 = ABS(dVar177);
                      dVar199 = ABS(dVar191);
                      if (dVar204 <= dVar177) {
                        dVar177 = dVar204;
                      }
                      if (dVar177 <= dVar199) {
                        dVar199 = dVar177;
                      }
                      uVar180 = -(ulong)(0.0 < dVar189 * dVar191) & (ulong)dVar199;
                      local_a28 = (double)(~uVar175 & (uVar180 ^ 0x8000000000000000) |
                                          uVar175 & uVar180);
                    }
                    dVar177 = dVar195;
                    if (dVar202 <= dVar195) {
                      dVar177 = dVar202;
                    }
                    dVar199 = dVar195;
                    if (dVar195 <= dVar202) {
                      dVar199 = dVar202;
                    }
                    iVar91 = 0;
                    iVar92 = 0;
                    iVar142 = 0;
                    iVar134 = 0;
                    uVar158 = 0xffffffff;
                    do {
                      uVar120 = uVar158 + 1;
                      uVar148 = 0xffffffff;
                      iVar161 = iVar91;
                      do {
                        uVar1 = uVar148 + 1;
                        iVar121 = 5;
                        do {
                          if (((uVar31 >> (iVar161 + iVar121 & 0x1fU) & 1) != 0) &&
                             ((iVar121 != 6 || uVar148 != 0) || uVar158 != 0)) {
                            iVar92 = iVar92 + (uint)((iVar121 - 5U & 0xfffffffd) == 0 &&
                                                    (uVar148 == 0 && uVar158 == 0));
                            iVar142 = iVar142 + (uint)((iVar121 == 6 && uVar158 == 0) &&
                                                      (uVar1 & 0xfffffffd) == 0);
                            iVar134 = iVar134 + (uint)((iVar121 == 6 && uVar148 == 0) &&
                                                      (uVar120 & 0xfffffffd) == 0);
                          }
                          iVar121 = iVar121 + 1;
                        } while (iVar121 != 8);
                        iVar161 = iVar161 + 3;
                        uVar148 = uVar1;
                      } while (uVar1 != 2);
                      iVar91 = iVar91 + 9;
                      uVar158 = uVar120;
                    } while (uVar120 != 2);
                    dVar202 = 2.0;
                    if ((uVar31 >> 0x15 & 1) != 0) {
                      lVar115 = -1;
                      cVar144 = '\b';
                      dVar204 = dVar195;
                      dVar202 = dVar195;
                      do {
                        lVar133 = 0;
                        cVar152 = cVar144;
                        do {
                          lVar136 = 0;
                          dVar189 = dVar202;
                          do {
                            dVar202 = dVar189;
                            if (((int)lVar136 != 1 || ((int)lVar133 != 0 || (int)lVar115 != 0)) &&
                               ((1 << (cVar152 + (char)lVar136 & 0x1fU) & uVar31) != 0)) {
                              dVar191 = pdVar37[lVar124 + (iVar88 + (int)lVar115) * lVar36 +
                                                          (iVar89 + (int)lVar133) * lVar35 +
                                                          (long)(iVar83 + (int)lVar136)];
                              dVar202 = dVar191;
                              if (dVar191 <= dVar189) {
                                dVar202 = dVar189;
                              }
                              if (dVar191 < dVar204) {
                                dVar204 = dVar191;
                              }
                            }
                            lVar136 = lVar136 + 1;
                            dVar189 = dVar202;
                          } while (lVar136 != 3);
                          cVar152 = cVar152 + '\x03';
                          bVar174 = lVar133 == 0;
                          lVar133 = lVar133 + 1;
                        } while (bVar174);
                        lVar115 = lVar115 + 1;
                        cVar144 = cVar144 + '\t';
                      } while (lVar115 != 2);
                      dVar189 = (((pdVar61 + lVar128 + lVar104 + (lVar132 - lVar154))[lVar64] -
                                 dVar201) * local_a28 +
                                (0.5 - dVar190) * local_9f8 +
                                (pdVar61[lVar128 + lVar104 + (lVar132 - lVar154)] - dVar193) *
                                local_968 + dVar195) - dVar195;
                      if (dVar189 <= 1e-13) {
                        dVar202 = 1.0;
                        if ((dVar189 < -1e-13) &&
                           (dVar202 = (dVar204 - dVar195) / dVar189, 1.0 <= dVar202)) {
                          dVar202 = 1.0;
                        }
                      }
                      else {
                        dVar202 = (dVar202 - dVar195) / dVar189;
                        if (1.0 <= dVar202) {
                          dVar202 = 1.0;
                        }
                      }
                      if (2.0 <= dVar202) {
                        dVar202 = 2.0;
                      }
                    }
                    dVar204 = dVar202;
                    if ((short)uVar31 < 0) {
                      lVar115 = -1;
                      cVar144 = '\x05';
                      pdVar118 = pdVar143;
                      dVar204 = dVar195;
                      dVar189 = dVar195;
                      do {
                        pdVar150 = pdVar118;
                        lVar133 = -1;
                        cVar152 = cVar144;
                        do {
                          lVar136 = 0;
                          dVar191 = dVar204;
                          do {
                            dVar204 = dVar191;
                            if (((int)lVar136 != 1 || ((int)lVar133 != 0 || (int)lVar115 != 0)) &&
                               ((1 << (cVar152 + (char)lVar136 & 0x1fU) & uVar31) != 0)) {
                              dVar200 = pdVar150[lVar136];
                              dVar204 = dVar200;
                              if (dVar200 <= dVar191) {
                                dVar204 = dVar191;
                              }
                              if (dVar200 < dVar189) {
                                dVar189 = dVar200;
                              }
                            }
                            lVar136 = lVar136 + 1;
                            dVar191 = dVar204;
                          } while (lVar136 != 3);
                          pdVar150 = pdVar150 + lVar35;
                          cVar152 = cVar152 + '\x03';
                          bVar174 = lVar133 != 0;
                          lVar133 = lVar133 + 1;
                        } while (bVar174);
                        lVar115 = lVar115 + 1;
                        pdVar118 = pdVar118 + lVar36;
                        cVar144 = cVar144 + '\t';
                      } while (lVar115 != 2);
                      dVar191 = (((pdVar61 + lVar129 + lVar104 + (lVar132 - lVar154))[lVar64] -
                                 dVar201) * local_a28 +
                                (((pdVar61[lVar129 + lVar104 + (lVar132 - lVar154)] - dVar193) *
                                  local_968 + dVar195) - (dVar190 + 0.5) * local_9f8)) - dVar195;
                      if (dVar191 <= 1e-13) {
                        dVar204 = 1.0;
                        if ((dVar191 < -1e-13) &&
                           (dVar204 = (dVar189 - dVar195) / dVar191, 1.0 <= dVar204)) {
                          dVar204 = 1.0;
                        }
                      }
                      else {
                        dVar204 = (dVar204 - dVar195) / dVar191;
                        if (1.0 <= dVar204) {
                          dVar204 = 1.0;
                        }
                      }
                      if (dVar202 <= dVar204) {
                        dVar204 = dVar202;
                      }
                    }
                    dVar202 = dVar204;
                    if ((uVar31 >> 0x13 & 1) != 0) {
                      lVar115 = -1;
                      cVar144 = '\x06';
                      dVar202 = dVar195;
                      dVar189 = dVar195;
                      do {
                        lVar133 = -1;
                        cVar152 = cVar144;
                        do {
                          lVar136 = 0;
                          dVar191 = dVar202;
                          do {
                            dVar202 = dVar191;
                            if ((((int)lVar133 != 0 || (int)lVar115 != 0) || (int)lVar136 != 0) &&
                               ((1 << (cVar152 + (char)lVar136 & 0x1fU) & uVar31) != 0)) {
                              dVar200 = pdVar37[lVar124 + (iVar88 + (int)lVar115) * lVar36 +
                                                          (iVar89 + (int)lVar133) * lVar35 +
                                                          (long)(int)(uVar2 + (int)lVar136)];
                              dVar202 = dVar200;
                              if (dVar200 <= dVar191) {
                                dVar202 = dVar191;
                              }
                              if (dVar200 < dVar189) {
                                dVar189 = dVar200;
                              }
                            }
                            lVar136 = lVar136 + 1;
                            dVar191 = dVar202;
                          } while (lVar136 == 1);
                          lVar133 = lVar133 + 1;
                          cVar152 = cVar152 + '\x03';
                        } while (lVar133 != 2);
                        lVar115 = lVar115 + 1;
                        cVar144 = cVar144 + '\t';
                      } while (lVar115 != 2);
                      dVar191 = ((dVar183 - dVar201) * local_a28 +
                                (dVar186 - dVar190) * local_9f8 +
                                (0.5 - dVar193) * local_968 + dVar195) - dVar195;
                      if (dVar191 <= 1e-13) {
                        dVar202 = 1.0;
                        if ((dVar191 < -1e-13) &&
                           (dVar202 = (dVar189 - dVar195) / dVar191, 1.0 <= dVar202)) {
                          dVar202 = 1.0;
                        }
                      }
                      else {
                        dVar202 = (dVar202 - dVar195) / dVar191;
                        if (1.0 <= dVar202) {
                          dVar202 = 1.0;
                        }
                      }
                      if (dVar204 <= dVar202) {
                        dVar202 = dVar204;
                      }
                    }
                    dVar204 = dVar202;
                    if ((uVar31 >> 0x11 & 1) != 0) {
                      lVar115 = -1;
                      cVar144 = '\x05';
                      dVar189 = dVar195;
                      dVar204 = dVar195;
                      do {
                        lVar133 = -1;
                        cVar152 = cVar144;
                        do {
                          lVar136 = 0;
                          do {
                            if (((int)lVar136 != 1 || ((int)lVar133 != 0 || (int)lVar115 != 0)) &&
                               ((1 << (cVar152 + (char)lVar136 & 0x1fU) & uVar31) != 0)) {
                              dVar191 = pdVar37[lVar124 + (iVar88 + (int)lVar115) * lVar36 +
                                                          (iVar89 + (int)lVar133) * lVar35 +
                                                          (long)(iVar83 + (int)lVar136)];
                              dVar200 = dVar191;
                              if (dVar191 <= dVar204) {
                                dVar200 = dVar204;
                              }
                              dVar204 = dVar200;
                              if (dVar191 < dVar189) {
                                dVar189 = dVar191;
                              }
                            }
                            lVar136 = lVar136 + 1;
                          } while (lVar136 != 2);
                          lVar133 = lVar133 + 1;
                          cVar152 = cVar152 + '\x03';
                        } while (lVar133 != 2);
                        lVar115 = lVar115 + 1;
                        cVar144 = cVar144 + '\t';
                      } while (lVar115 != 2);
                      dVar191 = (((pdVar57 + lVar110 + lVar99 + (lVar132 - lVar153))[lVar60] -
                                 dVar201) * local_a28 +
                                (pdVar57[lVar110 + lVar99 + (lVar132 - lVar153)] - dVar190) *
                                local_9f8 + (dVar195 - (dVar193 + 0.5) * local_968)) - dVar195;
                      if (dVar191 <= 1e-13) {
                        dVar204 = 1.0;
                        if ((dVar191 < -1e-13) &&
                           (dVar204 = (dVar189 - dVar195) / dVar191, 1.0 <= dVar204)) {
                          dVar204 = 1.0;
                        }
                      }
                      else {
                        dVar204 = (dVar204 - dVar195) / dVar191;
                        if (1.0 <= dVar204) {
                          dVar204 = 1.0;
                        }
                      }
                      if (dVar202 <= dVar204) {
                        dVar204 = dVar202;
                      }
                    }
                    dVar202 = dVar204;
                    if ((uVar31 >> 0x1b & 1) != 0) {
                      cVar144 = '\x0e';
                      lVar115 = 0;
                      dVar189 = dVar195;
                      dVar202 = dVar195;
                      do {
                        lVar133 = -1;
                        cVar152 = cVar144;
                        do {
                          lVar136 = 0;
                          do {
                            if (((int)lVar136 != 1 || ((int)lVar133 != 0 || (int)lVar115 != 0)) &&
                               ((1 << (cVar152 + (char)lVar136 & 0x1fU) & uVar31) != 0)) {
                              dVar191 = pdVar37[lVar124 + (iVar88 + (int)lVar115) * lVar36 +
                                                          (iVar89 + (int)lVar133) * lVar35 +
                                                          (long)(iVar83 + (int)lVar136)];
                              dVar200 = dVar191;
                              if (dVar191 <= dVar202) {
                                dVar200 = dVar202;
                              }
                              dVar202 = dVar200;
                              if (dVar191 < dVar189) {
                                dVar189 = dVar191;
                              }
                            }
                            lVar136 = lVar136 + 1;
                          } while (lVar136 != 3);
                          lVar133 = lVar133 + 1;
                          cVar152 = cVar152 + '\x03';
                        } while (lVar133 != 2);
                        cVar144 = cVar144 + '\t';
                        bVar174 = lVar115 == 0;
                        lVar115 = lVar115 + 1;
                      } while (bVar174);
                      dVar191 = ((0.5 - dVar201) * local_a28 +
                                ((pdVar65 + lVar130 + lVar167 + (lVar132 - lVar155))[lVar68] -
                                dVar190) * local_9f8 +
                                (pdVar65[lVar130 + lVar167 + (lVar132 - lVar155)] - dVar193) *
                                local_968 + dVar195) - dVar195;
                      if (dVar191 <= 1e-13) {
                        dVar202 = 1.0;
                        if ((dVar191 < -1e-13) &&
                           (dVar202 = (dVar189 - dVar195) / dVar191, 1.0 <= dVar202)) {
                          dVar202 = 1.0;
                        }
                      }
                      else {
                        dVar202 = (dVar202 - dVar195) / dVar191;
                        if (1.0 <= dVar202) {
                          dVar202 = 1.0;
                        }
                      }
                      if (dVar204 <= dVar202) {
                        dVar202 = dVar204;
                      }
                    }
                    dVar204 = dVar202;
                    if ((uVar31 >> 9 & 1) != 0) {
                      cVar144 = '\x05';
                      lVar115 = -1;
                      dVar189 = dVar195;
                      dVar204 = dVar195;
                      do {
                        lVar133 = -1;
                        cVar152 = cVar144;
                        do {
                          lVar136 = 0;
                          do {
                            if (((int)lVar136 != 1 || ((int)lVar133 != 0 || (int)lVar115 != 0)) &&
                               ((1 << (cVar152 + (char)lVar136 & 0x1fU) & uVar31) != 0)) {
                              dVar191 = pdVar37[lVar124 + (iVar88 + (int)lVar115) * lVar36 +
                                                          (iVar89 + (int)lVar133) * lVar35 +
                                                          (long)(iVar83 + (int)lVar136)];
                              dVar200 = dVar191;
                              if (dVar191 <= dVar204) {
                                dVar200 = dVar204;
                              }
                              dVar204 = dVar200;
                              if (dVar191 < dVar189) {
                                dVar189 = dVar191;
                              }
                            }
                            lVar136 = lVar136 + 1;
                          } while (lVar136 != 3);
                          lVar133 = lVar133 + 1;
                          cVar152 = cVar152 + '\x03';
                        } while (lVar133 != 2);
                        cVar144 = cVar144 + '\t';
                        bVar174 = lVar115 != 0;
                        lVar115 = lVar115 + 1;
                      } while (bVar174);
                      dVar191 = ((((pdVar65 + lVar130 + lVar168 + (lVar132 - lVar155))[lVar68] -
                                  dVar190) * local_9f8 +
                                 (pdVar65[lVar130 + lVar168 + (lVar132 - lVar155)] - dVar193) *
                                 local_968 + dVar195) - (dVar201 + 0.5) * local_a28) - dVar195;
                      if (dVar191 <= 1e-13) {
                        dVar204 = 1.0;
                        if ((dVar191 < -1e-13) &&
                           (dVar204 = (dVar189 - dVar195) / dVar191, 1.0 <= dVar204)) {
                          dVar204 = 1.0;
                        }
                      }
                      else {
                        dVar204 = (dVar204 - dVar195) / dVar191;
                        if (1.0 <= dVar204) {
                          dVar204 = 1.0;
                        }
                      }
                      if (dVar202 <= dVar204) {
                        dVar204 = dVar202;
                      }
                    }
                    dVar202 = 0.0;
                    if (1 < iVar92) {
                      dVar202 = dVar204;
                    }
                    dVar189 = 0.0;
                    if (1 < iVar142) {
                      dVar189 = dVar204;
                    }
                    dVar191 = 0.0;
                    if (1 < iVar134) {
                      dVar191 = dVar204;
                    }
                    if ((((dVar197 == 1.0) && (!NAN(dVar197))) && (dVar203 == 1.0)) &&
                       (((!NAN(dVar203) &&
                         (pdVar54[lVar107 + lVar163 + ((iVar90 - iVar18) + -2)] == 1.0)) &&
                        (!NAN(pdVar54[lVar107 + lVar163 + ((iVar90 - iVar18) + -2)]))))) {
                      dVar202 = 1.0;
                    }
                    if (((dVar197 == 1.0) && (!NAN(dVar197))) &&
                       ((pdVar54[lVar163 + lVar131 + lVar159] == 1.0 &&
                        (((!NAN(pdVar54[lVar163 + lVar131 + lVar159]) &&
                          (pdVar54[lVar163 + lVar114 + lVar159] == 1.0)) &&
                         (!NAN(pdVar54[lVar163 + lVar114 + lVar159]))))))) {
                      dVar189 = 1.0;
                    }
                    if (((dVar197 == 1.0) && (!NAN(dVar197))) &&
                       (((pdVar54[lVar107 + lVar159 + lVar125] == 1.0 &&
                         ((!NAN(pdVar54[lVar107 + lVar159 + lVar125]) &&
                          (pdVar54[lVar107 + lVar159 + lVar105] == 1.0)))) &&
                        (!NAN(pdVar54[lVar107 + lVar159 + lVar105]))))) {
                      dVar191 = 1.0;
                    }
                    dVar203 = (dVar183 - dVar201) * local_a28 * dVar191 +
                              (dVar186 - dVar190) * local_9f8 * dVar189 +
                              (0.5 - dVar193) * local_968 * dVar202 + dVar195;
                    if (dVar203 <= dVar199) {
                      dVar199 = dVar203;
                    }
                    if (dVar177 <= dVar199) {
                      dVar177 = dVar199;
                    }
                    dVar177 = pdVar39[lVar109 + lVar98 + (lVar132 - lVar140)] * dVar176 * -0.5 *
                              local_968 * dVar202 + dVar177;
                  }
LAB_0041002d:
                  pdVar46[local_858 * lVar49 +
                          (local_850 - iVar15) * lVar48 +
                          (local_840 - iVar14) * lVar47 + (long)(int)(~uVar13 + iVar90)] = dVar177;
                  pdVar42[local_858 * lVar45 +
                          (local_850 - iVar137) * lVar44 +
                          (local_840 - iVar11) * lVar43 + (lVar156 - iVar10)] = dVar178;
                  lVar156 = lVar156 + 1;
                  local_6d8 = local_6d8 + 1;
                  local_6d0 = local_6d0 + 1;
                  local_6c8 = local_6c8 + 1;
                  local_9b8 = local_9b8 + 0x100000000;
                  lVar146 = lVar146 + 0x100000000;
                  iVar82 = iVar82 + 1;
                  iVar83 = iVar83 + 1;
                  pdVar143 = pdVar143 + 1;
                  uVar2 = uVar2 + 1;
                } while (iVar28 + 1 != (int)lVar156);
              }
              local_840 = local_840 + 1;
              local_798 = local_798 + lVar32;
              local_790 = local_790 + lVar32;
              local_788 = local_788 + lVar32;
              local_838 = local_838 + lVar35;
            } while (iVar29 + 1 != (int)local_840);
          }
          local_850 = local_850 + 1;
          local_7c8 = local_7c8 + lVar33;
          local_7c0 = local_7c0 + lVar33;
          local_7b8 = local_7b8 + lVar33;
          local_848 = local_848 + lVar36;
        } while (iVar30 + 1 != (int)local_850);
      }
      local_858 = local_858 + 1;
      local_7e0 = local_7e0 + lVar38;
    } while (local_858 != 3);
  }
  else {
    local_2d8.q.p = q->p;
    local_2d8.q.jstride = q->jstride;
    local_2d8.q.kstride = q->kstride;
    local_2d8.q.nstride = q->nstride;
    local_2d8.q.begin.x = (q->begin).x;
    local_2d8.q.begin.y = (q->begin).y;
    uVar69 = *(undefined8 *)&(q->begin).z;
    uVar70 = (q->end).y;
    local_2d8.q._52_8_ = *(undefined8 *)&(q->end).z;
    local_2d8.q.begin.z = (int)uVar69;
    local_2d8.q.end.x = (int)((ulong)uVar69 >> 0x20);
    local_2d8.ccvel.p = ccvel->p;
    local_2d8.ccvel.jstride = ccvel->jstride;
    local_2d8.ccvel.kstride = ccvel->kstride;
    local_2d8.ccvel.nstride = ccvel->nstride;
    local_2d8.ccvel.begin.x = (ccvel->begin).x;
    local_2d8.ccvel.begin.y = (ccvel->begin).y;
    uVar71 = (ccvel->end).x;
    uVar72 = (ccvel->end).y;
    local_2d8.ccvel._52_8_ = *(undefined8 *)&(ccvel->end).z;
    local_2d8.ccvel.begin.z = (int)*(undefined8 *)&(ccvel->begin).z;
    local_2d8.Imx.p = Imx->p;
    local_2d8.Imx.jstride = Imx->jstride;
    local_2d8.Imx.kstride = Imx->kstride;
    local_2d8.Imx.nstride = Imx->nstride;
    local_2d8.Imx.begin.x = (Imx->begin).x;
    local_2d8.Imx.begin.y = (Imx->begin).y;
    uVar69 = *(undefined8 *)&(Imx->begin).z;
    uVar73 = (Imx->end).y;
    local_2d8.Imx._52_8_ = *(undefined8 *)&(Imx->end).z;
    local_2d8.Imx.begin.z = (int)uVar69;
    local_2d8.Imx.end.x = (int)((ulong)uVar69 >> 0x20);
    local_2d8.Ipx.p = Ipx->p;
    local_2d8.Ipx.jstride = Ipx->jstride;
    local_2d8.Ipx.kstride = Ipx->kstride;
    local_2d8.Ipx.nstride = Ipx->nstride;
    local_2d8.Ipx.begin.x = (Ipx->begin).x;
    local_2d8.Ipx.begin.y = (Ipx->begin).y;
    uVar74 = (Ipx->end).x;
    uVar75 = (Ipx->end).y;
    local_2d8.Ipx._52_8_ = *(undefined8 *)&(Ipx->end).z;
    local_2d8.Ipx.begin.z = (int)*(undefined8 *)&(Ipx->begin).z;
    local_2d8.pbc = pbc;
    local_2d8.flag.p = flag->p;
    local_2d8.flag.jstride = flag->jstride;
    local_2d8.flag.kstride = flag->kstride;
    local_2d8.flag.nstride = flag->nstride;
    local_2d8.flag.begin.x = (flag->begin).x;
    local_2d8.flag.begin.y = (flag->begin).y;
    uVar69 = *(undefined8 *)&(flag->begin).z;
    uVar76 = (flag->end).y;
    local_2d8.flag._52_8_ = *(undefined8 *)&(flag->end).z;
    local_2d8.flag.begin.z = (int)uVar69;
    local_2d8.flag.end.x = (int)((ulong)uVar69 >> 0x20);
    local_2d8.ccc.p = ccc->p;
    local_2d8.ccc.jstride = ccc->jstride;
    local_2d8.ccc.kstride = ccc->kstride;
    local_2d8.ccc.nstride = ccc->nstride;
    local_2d8.ccc.begin.x = (ccc->begin).x;
    local_2d8.ccc.begin.y = (ccc->begin).y;
    uVar69 = *(undefined8 *)&(ccc->begin).z;
    uVar77 = (ccc->end).y;
    local_2d8.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
    local_2d8.ccc.begin.z = (int)uVar69;
    local_2d8.ccc.end.x = (int)((ulong)uVar69 >> 0x20);
    local_2d8.vfrac.p = vfrac->p;
    local_2d8.vfrac.jstride = vfrac->jstride;
    local_2d8.vfrac.kstride = vfrac->kstride;
    local_2d8.vfrac.nstride = vfrac->nstride;
    local_2d8.vfrac.begin.x = (vfrac->begin).x;
    local_2d8.vfrac.begin.y = (vfrac->begin).y;
    uVar69 = *(undefined8 *)&(vfrac->begin).z;
    uVar78 = (vfrac->end).y;
    local_2d8.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
    local_2d8.vfrac.begin.z = (int)uVar69;
    local_2d8.vfrac.end.x = (int)((ulong)uVar69 >> 0x20);
    local_2d8.fcx.p = fcx->p;
    local_2d8.fcx.jstride = fcx->jstride;
    local_2d8.fcx.kstride = fcx->kstride;
    local_2d8.fcx.nstride = fcx->nstride;
    local_2d8.fcx.begin.x = (fcx->begin).x;
    local_2d8.fcx.begin.y = (fcx->begin).y;
    uVar69 = *(undefined8 *)&(fcx->begin).z;
    uVar79 = (fcx->end).y;
    local_2d8.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
    local_2d8.fcx.begin.z = (int)uVar69;
    local_2d8.fcx.end.x = (int)((ulong)uVar69 >> 0x20);
    local_2d8.fcy.p = fcy->p;
    local_2d8.fcy.jstride = fcy->jstride;
    local_2d8.fcy.kstride = fcy->kstride;
    local_2d8.fcy.nstride = fcy->nstride;
    local_2d8.fcy.begin.x = (fcy->begin).x;
    local_2d8.fcy.begin.y = (fcy->begin).y;
    uVar69 = *(undefined8 *)&(fcy->begin).z;
    uVar80 = (fcy->end).y;
    local_2d8.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
    local_2d8.fcy.begin.z = (int)uVar69;
    local_2d8.fcy.end.x = (int)((ulong)uVar69 >> 0x20);
    local_2d8.fcz.p = fcz->p;
    local_2d8.fcz.jstride = fcz->jstride;
    local_2d8.fcz.kstride = fcz->kstride;
    local_2d8.fcz.nstride = fcz->nstride;
    local_2d8.fcz.begin.x = (fcz->begin).x;
    local_2d8.fcz.begin.y = (fcz->begin).y;
    uVar69 = *(undefined8 *)&(fcz->begin).z;
    uVar81 = (fcz->end).y;
    local_2d8.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
    local_2d8.fcz.begin.z = (int)uVar69;
    local_2d8.fcz.end.x = (int)((ulong)uVar69 >> 0x20);
    iVar6 = (xebox->smallend).vect[0];
    iVar7 = (xebox->smallend).vect[1];
    iVar8 = (xebox->smallend).vect[2];
    iVar9 = (xebox->bigend).vect[0];
    iVar10 = (xebox->bigend).vect[1];
    iVar11 = (xebox->bigend).vect[2];
    iVar137 = 0;
    local_2d8.q.end.y = uVar70;
    local_2d8.ccvel.end.x = uVar71;
    local_2d8.ccvel.end.y = uVar72;
    local_2d8.domain_ilo = iVar165;
    local_2d8.domain_jlo = iVar169;
    local_2d8.domain_klo = iVar4;
    local_2d8.domain_ihi = iVar160;
    local_2d8.domain_jhi = iVar3;
    local_2d8.domain_khi = iVar5;
    local_2d8.Imx.end.y = uVar73;
    local_2d8.Ipx.end.x = uVar74;
    local_2d8.Ipx.end.y = uVar75;
    local_2d8.dtdx = dVar176;
    local_2d8.flag.end.y = uVar76;
    local_2d8.ccc.end.y = uVar77;
    local_2d8.vfrac.end.y = uVar78;
    local_2d8.fcx.end.y = uVar79;
    local_2d8.fcy.end.y = uVar80;
    local_2d8.fcz.end.y = uVar81;
    do {
      iVar165 = iVar8;
      if (iVar8 <= iVar11) {
        do {
          iVar169 = iVar7;
          if (iVar7 <= iVar10) {
            do {
              iVar160 = iVar6;
              if (iVar6 <= iVar9) {
                do {
                  PredictVelOnXFace::anon_class_680_18_15492e0f::operator()
                            (&local_2d8,iVar160,iVar169,iVar165,iVar137);
                  iVar160 = iVar160 + 1;
                } while (iVar9 + 1 != iVar160);
              }
              bVar174 = iVar169 != iVar10;
              iVar169 = iVar169 + 1;
            } while (bVar174);
          }
          bVar174 = iVar165 != iVar11;
          iVar165 = iVar165 + 1;
        } while (bVar174);
      }
      iVar137 = iVar137 + 1;
    } while (iVar137 != 3);
  }
  return;
}

Assistant:

void
EBPLM::PredictVelOnXFace (Box const& xebox,
                          Array4<Real> const& Imx, Array4<Real> const& Ipx,
                          Array4<Real const> const& q,
                          Array4<Real const> const& ccvel,
                          Array4<EBCellFlag const> const& flag,
                          Array4<Real const> const& vfrac,
                          AMREX_D_DECL(Array4<Real const> const& fcx,
                                       Array4<Real const> const& fcy,
                                       Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Geometry& geom,
                          Real dt,
                          Vector<BCRec> const& h_bcrec,
                          BCRec const* pbc)
{
    const Real dx = geom.CellSize(0);
    const Real dtdx = dt/dx;

    int ncomp = AMREX_SPACEDIM;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::y));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= xebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= xebox.bigEnd(0)    ) ||
#if (AMREX_SPACEDIM == 3)
         (has_extdir_or_ho_lo_z && domain_klo >= xebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= xebox.bigEnd(2)    ) ||
#endif
         (has_extdir_or_ho_lo_y && domain_jlo >= xebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= xebox.bigEnd(1)    ) )
    {
        amrex::ParallelFor(xebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                  AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imx,Ipx,dtdx,pbc,flag,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(-1,0,0))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);
#endif

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. &&
                                           vfrac(i+1,j,k) == 1. && vfrac(i+2,j,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i+1,j,k) == 1.) {

                    int order = 2;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We need to use LS slopes
                } else {

                    Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcx(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_x = -0.5 - ccc(i,j,k,0);,
                                 Real delta_y =  yf  - ccc(i,j,k,1);,
                                 Real delta_z =  zf  - ccc(i,j,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdx * ccvel(i,j,k,0) * slopes_eb_hi[0];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i-1,j,k) with all values at cell centers
                if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i-3,j,k) == 1. &&
                                             vfrac(i  ,j,k) == 1. && vfrac(i+1,j,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i-1,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i  ,j,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i-1,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We need to use LS slopes
                } else {

                    Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcx(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_x = 0.5 - ccc(i-1,j,k,0);,
                                 Real delta_y = yf  - ccc(i-1,j,k,1);,
                                 Real delta_z = zf  - ccc(i-1,j,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i-1,j,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);


#if (AMREX_SPACEDIM == 3)
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdx * ccvel(i-1,j,k,0) * slopes_eb_lo[0];

                }  // end of making qmns
            }

            Ipx(i-1,j,k,n) = qmns;
            Imx(i  ,j,k,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(xebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                          AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imx,Ipx,dtdx,pbc,flag,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(-1,0,0))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. &&
                                           vfrac(i+1,j,k) == 1. && vfrac(i+2,j,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,0) * dtdx) *
                        amrex_calc_xslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i+1,j,k) == 1.) {

                    int order = 2;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,0) * dtdx) *
                        amrex_calc_xslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcx(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_x = -0.5 - ccc(i,j,k,0);,
                                Real delta_y =  yf  - ccc(i,j,k,1);,
                                Real delta_z =  zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdx * ccvel(i,j,k,0) * slopes_eb_hi[0];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i-1,j,k) with all values at cell centers
                if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i-3,j,k) == 1. &&
                                             vfrac(i  ,j,k) == 1. && vfrac(i+1,j,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope(i-1,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i  ,j,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope(i-1,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcx(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_x = 0.5 - ccc(i-1,j,k,0);,
                                Real delta_y = yf  - ccc(i-1,j,k,1);,
                                Real delta_z = zf  - ccc(i-1,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i-1,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdx * ccvel(i-1,j,k,0) * slopes_eb_lo[0];

                }  // end of making qmns
            }

            Ipx(i-1,j,k,n) = qmns;
            Imx(i  ,j,k,n) = qpls;
        });
    }
}